

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_host.c
# Opt level: O1

void test_distributed_fft_3d_compare(void)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  int *dims;
  kiss_fft_cpx *pkVar4;
  kiss_fft_cpx *fout;
  kiss_fftnd_cfg st;
  void *__ptr;
  ulong uVar5;
  void *__ptr_00;
  uint uVar6;
  uint uVar7;
  dfft_plan *pdVar8;
  undefined8 uVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  byte bVar17;
  float fVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 auStack_328 [31];
  undefined8 uStack_230;
  int *piStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined *puStack_208;
  code *pcStack_200;
  int s;
  kiss_fft_cpx *local_1e8;
  long local_1e0;
  int p;
  ulong local_1d0;
  undefined8 local_1c8;
  kiss_fft_cpx *local_1b8;
  int pidx [3];
  dfft_plan plan;
  
  bVar17 = 0;
  pcStack_200 = (code *)0x10252e;
  MPI_Comm_size(&ompi_mpi_comm_world,&p);
  pcStack_200 = (code *)0x10253b;
  MPI_Comm_rank(&ompi_mpi_comm_world,&s);
  pcStack_200 = (code *)0x102545;
  piVar3 = (int *)malloc(0xc);
  pcStack_200 = (code *)0x102559;
  fVar18 = powf((float)p,0.33333334);
  uVar7 = 1;
  do {
    uVar6 = uVar7;
    uVar7 = uVar6 * 2;
  } while ((int)uVar6 < (int)(fVar18 + 0.5));
  if (s == 0) {
    pcStack_200 = (code *)0x10258f;
    printf("Processor grid: ");
  }
  iVar15 = 1;
  lVar11 = 0;
  do {
    uVar7 = 1;
    if ((int)(iVar15 * uVar6) <= p) {
      uVar7 = uVar6;
    }
    piVar3[lVar11] = uVar7;
    if (s == 0) {
      pcStack_200 = (code *)0x1025cc;
      printf("%d x ",(ulong)uVar7);
    }
    iVar15 = iVar15 * uVar7;
    lVar11 = lVar11 + 1;
  } while (lVar11 == 1);
  uVar5 = (long)p / (long)iVar15;
  piVar3[2] = (int)uVar5;
  if (s == 0) {
    pcStack_200 = (code *)0x1025fc;
    printf("%d\n",uVar5 & 0xffffffff,(long)p % (long)iVar15 & 0xffffffff);
  }
  lVar11 = 2;
  iVar15 = s;
  do {
    iVar2 = piVar3[lVar11];
    pidx[lVar11] = iVar15 % iVar2;
    bVar16 = lVar11 != 0;
    lVar11 = lVar11 + -1;
    iVar15 = iVar15 / iVar2;
  } while (bVar16);
  pcStack_200 = (code *)0x10261f;
  dims = (int *)malloc(0xc);
  *dims = *piVar3 << 2;
  dims[1] = piVar3[1] << 3;
  dims[2] = piVar3[2] << 4;
  lVar11 = 0;
  do {
    if (s == 0) {
      pcStack_200 = (code *)0x10265e;
      printf("%d x ",(ulong)(uint)dims[lVar11]);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 == 1);
  if (s == 0) {
    pcStack_200 = (code *)0x102684;
    printf("%d matrix\n",(ulong)(uint)dims[2]);
  }
  pcStack_200 = (code *)0x1026a0;
  pkVar4 = (kiss_fft_cpx *)malloc((long)dims[2] * (long)dims[1] * (long)*dims * 8);
  pcStack_200 = (code *)0x1026ad;
  srand(0x3039);
  pcStack_200 = (code *)0x1026c0;
  fVar18 = logf((float)(dims[1] * *dims * dims[2]));
  dVar20 = ((double)fVar18 * -0.5) / 0.6931471824645996 + 7.0;
  fVar18 = (float)dVar20;
  local_1c8 = CONCAT44((int)((ulong)dVar20 >> 0x20),fVar18);
  pcStack_200 = (code *)0x1026fc;
  fVar18 = powf(10.0,-fVar18);
  dVar20 = (double)fVar18;
  pcStack_200 = (code *)0x102723;
  printf("Testing with %f sig digits, rel precision %f, abs precision %f\n",
         SUB84((double)(float)local_1c8,0),dVar20,dVar20);
  iVar15 = *dims;
  local_1c8 = (long)dims[1];
  uVar7 = dims[2];
  lVar11 = (long)(int)uVar7;
  iVar2 = iVar15;
  local_1b8 = pkVar4;
  if (0 < (long)iVar15) {
    local_1e8 = (kiss_fft_cpx *)&pkVar4->i;
    local_1d0 = local_1c8 * lVar11 * 8;
    lVar14 = 0;
    do {
      local_1e0 = lVar14;
      if (0 < dims[1]) {
        lVar14 = 0;
        pkVar4 = local_1e8;
        do {
          if (0 < dims[2]) {
            lVar12 = 0;
            do {
              pcStack_200 = (code *)0x10279b;
              iVar2 = rand();
              pkVar4[lVar12 + -1].i = (float)iVar2 * 4.656613e-10;
              pcStack_200 = (code *)0x1027b6;
              iVar2 = rand();
              pkVar4[lVar12].r = (float)iVar2 * 4.656613e-10;
              lVar12 = lVar12 + 1;
            } while (lVar12 < dims[2]);
          }
          lVar14 = lVar14 + 1;
          pkVar4 = pkVar4 + lVar11;
        } while (lVar14 < dims[1]);
      }
      lVar14 = local_1e0 + 1;
      iVar2 = *dims;
      local_1e8 = (kiss_fft_cpx *)((long)&local_1e8->r + local_1d0);
    } while (lVar14 < iVar2);
  }
  pkVar4 = local_1b8;
  pcStack_200 = (code *)0x102829;
  fout = (kiss_fft_cpx *)malloc((long)dims[2] * (long)dims[1] * (long)iVar2 * 8);
  pcStack_200 = (code *)0x102840;
  st = kiss_fftnd_alloc(dims,3,0,(void *)0x0,(size_t *)0x0);
  pcStack_200 = (code *)0x102853;
  kiss_fftnd(st,pkVar4,fout);
  pcStack_200 = (code *)0x10285d;
  __ptr = malloc(0x1000);
  if (0 < iVar15) {
    local_1d0 = (ulong)(uint)-(pidx[0] * 0x200 + pidx[1] * 0x80 + pidx[2] * 0x10);
    local_1e0 = 0;
    local_1e8 = local_1b8;
    do {
      if (0 < (int)(float)local_1c8) {
        lVar14 = 0;
        uVar5 = local_1d0;
        pkVar4 = local_1e8;
        do {
          if (0 < (int)uVar7) {
            uVar13 = 0;
            do {
              if ((((lVar14 < (int)((long)pidx[1] * 8) + 8 && (long)pidx[1] * 8 <= lVar14) &&
                    (local_1e0 < (int)((long)pidx[0] << 2) + 4 && (long)pidx[0] << 2 <= local_1e0))
                  && ((long)pidx[2] * 0x10 <= (long)uVar13)) &&
                 ((long)uVar13 < (long)((int)((long)pidx[2] * 0x10) + 0x10))) {
                *(kiss_fft_cpx *)((long)__ptr + (long)((int)uVar5 + (int)uVar13) * 8) =
                     pkVar4[uVar13];
              }
              uVar13 = uVar13 + 1;
            } while (uVar7 != uVar13);
          }
          lVar14 = lVar14 + 1;
          pkVar4 = pkVar4 + lVar11;
          uVar5 = uVar5 + 0x10;
        } while (lVar14 != local_1c8);
      }
      local_1e0 = local_1e0 + 1;
      local_1e8 = local_1e8 + local_1c8 * lVar11;
      local_1d0 = local_1d0 + 0x80;
    } while (local_1e0 != iVar15);
  }
  pcStack_200 = (code *)0x1029c5;
  __ptr_00 = malloc(0x1000);
  piStack_228 = pidx;
  pcStack_200 = (code *)proc_map;
  puStack_208 = &ompi_mpi_comm_world;
  uVar5 = 0;
  uStack_210 = 0;
  uStack_218 = 0;
  uStack_220 = 0;
  uStack_230 = 0x102a03;
  dfft_create_plan(&plan,3,dims,0,0,piVar3);
  pdVar8 = &plan;
  puVar10 = auStack_328;
  for (lVar11 = 0x26; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar10 = *(undefined8 *)pdVar8;
    pdVar8 = (dfft_plan *)((long)pdVar8 + (ulong)bVar17 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
  }
  dfft_execute(__ptr,__ptr_00,0);
  do {
    fVar18 = *(float *)((long)__ptr_00 + uVar5 * 8);
    fVar1 = *(float *)((long)__ptr_00 + uVar5 * 8 + 4);
    dVar22 = (double)fVar18;
    uVar19 = SUB84(dVar22,0);
    iVar15 = ((((uint)(uVar5 >> 7) & 0x1ffffff) + pidx[0] * 4) * (int)(float)local_1c8 +
             ((uint)(uVar5 >> 4) & 7 | pidx[1] << 3)) * uVar7 + ((uint)uVar5 & 0xf | pidx[2] << 4);
    dVar21 = (double)fout[iVar15].r;
    dVar24 = (double)fout[iVar15].i;
    if (dVar20 <= ABS(dVar21)) {
      dVar23 = (dVar20 + 1.0) * dVar22;
      dVar22 = (1.0 - dVar20) * dVar22;
      if ((((0.0 <= fVar18) && (dVar21 <= dVar23)) && (dVar22 <= dVar21)) ||
         (((fVar18 < 0.0 && (dVar23 <= dVar21)) && (dVar21 <= dVar22)))) goto LAB_00102b38;
      uVar9 = 0x239;
LAB_00102c53:
      pcStack_200 = (code *)0x102c5a;
      printf("Test failed at line %d! %f != %f (rel tol: %f)\n",uVar19,dVar21,uVar9);
      goto LAB_00102c5a;
    }
    if (dVar20 + dVar20 < ABS(dVar22)) {
      uVar9 = 0x235;
LAB_00102c29:
      pcStack_200 = (code *)0x102c30;
      printf("Test failed at line %d! abs(%f) >= %f \n",uVar9);
LAB_00102c5a:
      pcStack_200 = kiss_fft_alloc;
      exit(1);
    }
LAB_00102b38:
    dVar22 = (double)fVar1;
    uVar19 = SUB84(dVar22,0);
    if (dVar20 <= ABS(dVar24)) {
      dVar21 = (dVar20 + 1.0) * dVar22;
      dVar22 = (1.0 - dVar20) * dVar22;
      if ((((fVar1 < 0.0) || (dVar21 < dVar24)) || (dVar24 < dVar22)) &&
         (((0.0 <= fVar1 || (dVar24 < dVar21)) || (dVar22 < dVar24)))) {
        uVar9 = 0x242;
        dVar21 = dVar24;
        goto LAB_00102c53;
      }
    }
    else if (dVar20 + dVar20 < ABS(dVar22)) {
      uVar9 = 0x23e;
      goto LAB_00102c29;
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x200) {
      pcStack_200 = (code *)0x102bbe;
      free(local_1b8);
      pcStack_200 = (code *)0x102bc6;
      free(fout);
      pcStack_200 = (code *)0x102bce;
      free(__ptr_00);
      pcStack_200 = (code *)0x102bd6;
      free(__ptr);
      pcStack_200 = (code *)0x102bde;
      free(dims);
      pdVar8 = &plan;
      puVar10 = auStack_328;
      for (lVar11 = 0x26; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar10 = *(undefined8 *)pdVar8;
        pdVar8 = (dfft_plan *)((long)pdVar8 + (ulong)bVar17 * -0x10 + 8);
        puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
      }
      dfft_destroy_plan();
      return;
    }
  } while( true );
}

Assistant:

void test_distributed_fft_3d_compare()
    {
    int s,p;
    MPI_Comm_size(MPI_COMM_WORLD, &p);
    MPI_Comm_rank(MPI_COMM_WORLD, &s);

    int nd = 3;
    int *pdim;
    pdim = (int *) malloc(sizeof(int)*nd);
    /* choose a decomposition */
    int r = powf(p,1.0/(double)nd)+0.5;
    int root = 1;
    while (root < r) root*=2;
    int ptot = 1;
    if (!s) printf("Processor grid: ");
    int i;
    for (i = 0; i < nd-1; ++i)
        {
        pdim[i] = (((ptot*root) > p) ? 1 : root);
        ptot *= pdim[i];
        if (!s) printf("%d x ",pdim[i]);
        }
    pdim[nd-1] = p/ptot;
    if (!s) printf("%d\n", pdim[nd-1]);

    /* determine processor index */
    int pidx[3];
    int idx = s;
    for (i = 2; i >= 0; --i)
        {
        pidx[i] = idx % pdim[i];
        idx /= pdim[i];
        }

    int *dim_glob;
    dim_glob = (int *) malloc(sizeof(int)*nd);

    // Do a pdim[0]*4 x pdim[1]* 8 x pdim[2] * 16 FFT (powers of two)
    int local_nx = 4;
    int local_ny = 8;
    int local_nz = 16;
    dim_glob[0] = pdim[0]*local_nx;
    dim_glob[1] = pdim[1]*local_ny;
    dim_glob[2] = pdim[2]*local_nz;

    for (i = 0; i < nd-1; ++i)
        if (!s) printf("%d x ",dim_glob[i]);
    if (!s) printf("%d matrix\n", dim_glob[nd-1]);

    kiss_fft_cpx *in_kiss;
    in_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    srand(12345);

    float scale = dim_glob[0]*dim_glob[1]*dim_glob[2];
    /* assume 0.5 sig digit loss per addition/twiddling (empirical)*/
    float sig_digits = 7.0-0.5*logf(scale)/logf(2.0);
    double tol = powf(10.0,-sig_digits);
    double abs_tol = 1.0*tol;
    printf("Testing with %f sig digits, rel precision %f, abs precision %f\n", sig_digits,  tol, abs_tol);

    // fill table with complex random numbers in row major order
    int x,y,z;
    int nx = dim_glob[0];
    int ny = dim_glob[1];
    int nz = dim_glob[2];
    for (x = 0; x < dim_glob[0]; ++x)
        for (y = 0; y < dim_glob[1]; ++y)
            for (z = 0; z < dim_glob[2]; ++z)
                {
                // KISS has column-major storage
                in_kiss[z+nz*(y+ny*x)].r = (float)rand()/(float)RAND_MAX;
                in_kiss[z+nz*(y+ny*x)].i = (float)rand()/(float)RAND_MAX;
                }

    kiss_fft_cpx *out_kiss;
    out_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    // construct forward transform
    kiss_fftnd_cfg cfg = kiss_fftnd_alloc(dim_glob,3,0,NULL,NULL);

    // carry out conventional FFT
    kiss_fftnd(cfg, in_kiss, out_kiss);

    // compare to distributed FFT
    cpx_t * in;
    in = (cpx_t *)malloc(sizeof(cpx_t)*local_nx*local_ny*local_nz);

    int x_local, y_local, z_local;
    for (x = 0; x < nx; ++x)
        for (y = 0; y < ny; ++y)
            for (z = 0; z < nz; ++z)
                {
                if (x>=pidx[0]*local_nx && x < (pidx[0]+1)*local_nx && 
                    y>=pidx[1]*local_ny && y < (pidx[1]+1)*local_ny &&
                    z>=pidx[2]*local_nz && z < (pidx[2]+1)*local_nz)
                    {
                    x_local = x - pidx[0]*local_nx;
                    y_local = y - pidx[1]*local_ny;
                    z_local = z - pidx[2]*local_nz;

                    RE(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].r;
                    IM(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].i;
                    }
                }

    cpx_t *out;
    out = (cpx_t *) malloc(local_nx*local_ny*local_nz*sizeof(cpx_t));

    dfft_plan plan;
    dfft_create_plan(&plan,3, dim_glob, NULL, NULL, pdim,pidx, 0, 0, 0, MPI_COMM_WORLD, proc_map);

    // forward transform
    dfft_execute(in, out, 0, plan);

    // do comparison
    int n_wave_local = local_nx * local_ny * local_nz;
    for (i = 0; i < n_wave_local; ++i)
        {

        x_local = i / local_ny / local_nz;
        y_local = (i - x_local*local_ny*local_nz)/local_nz;
        z_local = i % local_nz;

        x = pidx[0]*local_nx + x_local;
        y = pidx[1]*local_ny + y_local;
        z = pidx[2]*local_nz + z_local;

        double re = RE(out[i]);
        double im = IM(out[i]);
        double re_kiss = out_kiss[z+nz*(y+ny*x)].r;
        double im_kiss = out_kiss[z+nz*(y+ny*x)].i;  

        if (fabs(re_kiss) < abs_tol)
            {
            CHECK_SMALL(re,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(re,re_kiss, tol);
            }

        if (fabs(im_kiss) < abs_tol)
            {
            CHECK_SMALL(im,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(im, im_kiss, tol);
            }
        }
    free(in_kiss);
    free(out_kiss);
    free(out);
    free(in);
    free(dim_glob);
    dfft_destroy_plan(plan);
    }